

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DExporter.cpp
# Opt level: O2

void Assimp::ExportSceneM3DA
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *pProperties)

{
  DeadlyImportError *this;
  allocator<char> local_39;
  string local_38;
  
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Assimp configured without M3D_ASCII support",&local_39);
  DeadlyImportError::DeadlyImportError(this,&local_38);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneM3DA(
		const char *pFile,
		IOSystem *pIOSystem,
		const aiScene *pScene,
		const ExportProperties *pProperties

) {
#ifdef M3D_ASCII
	// initialize the exporter
	M3DExporter exporter(pScene, pProperties);

	// perform ascii export
	exporter.doExport(pFile, pIOSystem, true);
#else
	throw DeadlyExportError("Assimp configured without M3D_ASCII support");
#endif
}